

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O2

arena_t * arena_init(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks)

{
  arena_t *paVar1;
  
  malloc_mutex_lock(tsdn,&arenas_lock);
  paVar1 = arena_init_locked(tsdn,ind,extent_hooks);
  arenas_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&arenas_lock.field_0 + 0x40));
  arena_new_create_background_thread(tsdn,ind);
  return paVar1;
}

Assistant:

arena_t *
arena_init(tsdn_t *tsdn, unsigned ind, extent_hooks_t *extent_hooks) {
	arena_t *arena;

	malloc_mutex_lock(tsdn, &arenas_lock);
	arena = arena_init_locked(tsdn, ind, extent_hooks);
	malloc_mutex_unlock(tsdn, &arenas_lock);

	arena_new_create_background_thread(tsdn, ind);

	return arena;
}